

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O0

void __thiscall
slang::ast::InsideExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (InsideExpression *this,SequenceMethodExprVisitor *visitor)

{
  Expression *this_00;
  iterator ppEVar1;
  Expression *range;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_20;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  SequenceMethodExprVisitor *visitor_local;
  InsideExpression *this_local;
  
  __range3 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)visitor;
  visitor_local = (SequenceMethodExprVisitor *)this;
  this_00 = left(this);
  Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
            (this_00,(SequenceMethodExprVisitor *)__range3);
  ___begin3 = rangeList(this);
  local_20 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)&__begin3;
  __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(local_20);
  ppEVar1 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(local_20);
  for (; __end3 != ppEVar1; __end3 = __end3 + 1) {
    Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
              (*__end3,(SequenceMethodExprVisitor *)__range3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto range : rangeList())
            range->visit(visitor);
    }